

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputImpl.cpp
# Opt level: O0

bool sf::priv::InputImpl::isKeyPressed(Key key)

{
  Display *display_00;
  char local_48 [8];
  char keys [32];
  KeyCode keycode;
  Display *display;
  KeySym keysym;
  Key key_local;
  
  switch(key) {
  case A:
    display = (Display *)0x61;
    break;
  case B:
    display = (Display *)0x62;
    break;
  case C:
    display = (Display *)0x63;
    break;
  case D:
    display = (Display *)0x64;
    break;
  case E:
    display = (Display *)0x65;
    break;
  case F:
    display = (Display *)0x66;
    break;
  case G:
    display = (Display *)0x67;
    break;
  case H:
    display = (Display *)0x68;
    break;
  case I:
    display = (Display *)0x69;
    break;
  case J:
    display = (Display *)0x6a;
    break;
  case K:
    display = (Display *)0x6b;
    break;
  case L:
    display = (Display *)0x6c;
    break;
  case M:
    display = (Display *)0x6d;
    break;
  case N:
    display = (Display *)0x6e;
    break;
  case O:
    display = (Display *)0x6f;
    break;
  case P:
    display = (Display *)0x70;
    break;
  case Q:
    display = (Display *)0x71;
    break;
  case R:
    display = (Display *)0x72;
    break;
  case S:
    display = (Display *)0x73;
    break;
  case T:
    display = (Display *)0x74;
    break;
  case U:
    display = (Display *)0x75;
    break;
  case V:
    display = (Display *)0x76;
    break;
  case W:
    display = (Display *)0x77;
    break;
  case X:
    display = (Display *)0x78;
    break;
  case Y:
    display = (Display *)0x79;
    break;
  case Z:
    display = (Display *)0x7a;
    break;
  case Num0:
    display = (Display *)0x30;
    break;
  case Num1:
    display = (Display *)0x31;
    break;
  case Num2:
    display = (Display *)0x32;
    break;
  case Num3:
    display = (Display *)0x33;
    break;
  case Num4:
    display = (Display *)0x34;
    break;
  case Num5:
    display = (Display *)0x35;
    break;
  case Num6:
    display = (Display *)0x36;
    break;
  case Num7:
    display = (Display *)0x37;
    break;
  case Num8:
    display = (Display *)0x38;
    break;
  case Num9:
    display = (Display *)0x39;
    break;
  case Escape:
    display = (Display *)0xff1b;
    break;
  case LControl:
    display = (Display *)0xffe3;
    break;
  case LShift:
    display = (Display *)0xffe1;
    break;
  case LAlt:
    display = (Display *)0xffe9;
    break;
  case LSystem:
    display = (Display *)0xffeb;
    break;
  case RControl:
    display = (Display *)0xffe4;
    break;
  case RShift:
    display = (Display *)0xffe2;
    break;
  case RAlt:
    display = (Display *)0xffea;
    break;
  case RSystem:
    display = (Display *)0xffec;
    break;
  case Menu:
    display = (Display *)0xff67;
    break;
  case LBracket:
    display = (Display *)0x5b;
    break;
  case RBracket:
    display = (Display *)0x5d;
    break;
  case SemiColon:
    display = (Display *)0x3b;
    break;
  case Comma:
    display = (Display *)0x2c;
    break;
  case Period:
    display = (Display *)0x2e;
    break;
  case Quote:
    display = (Display *)0x27;
    break;
  case Slash:
    display = (Display *)0x2f;
    break;
  case BackSlash:
    display = (Display *)0x5c;
    break;
  case Tilde:
    display = (Display *)0x60;
    break;
  case Equal:
    display = (Display *)0x3d;
    break;
  case Dash:
    display = (Display *)0x2d;
    break;
  case Space:
    display = (Display *)0x20;
    break;
  case Enter:
    display = (Display *)0xff0d;
    break;
  case BackSpace:
    display = (Display *)0xff08;
    break;
  case Tab:
    display = (Display *)0xff09;
    break;
  case PageUp:
    display = (Display *)0xff55;
    break;
  case PageDown:
    display = (Display *)0xff56;
    break;
  case End:
    display = (Display *)0xff57;
    break;
  case Home:
    display = (Display *)0xff50;
    break;
  case Insert:
    display = (Display *)0xff63;
    break;
  case Delete:
    display = (Display *)0xffff;
    break;
  case Add:
    display = (Display *)0xffab;
    break;
  case Subtract:
    display = (Display *)0xffad;
    break;
  case Multiply:
    display = (Display *)0xffaa;
    break;
  case Divide:
    display = (Display *)0xffaf;
    break;
  case Left:
    display = (Display *)0xff51;
    break;
  case Right:
    display = (Display *)0xff53;
    break;
  case Up:
    display = (Display *)0xff52;
    break;
  case Down:
    display = (Display *)0xff54;
    break;
  case Numpad0:
    display = (Display *)0xff9e;
    break;
  case Numpad1:
    display = (Display *)0xff9c;
    break;
  case Numpad2:
    display = (Display *)0xff99;
    break;
  case Numpad3:
    display = (Display *)0xff9b;
    break;
  case Numpad4:
    display = (Display *)0xff96;
    break;
  case Numpad5:
    display = (Display *)0xff9d;
    break;
  case Numpad6:
    display = (Display *)0xff98;
    break;
  case Numpad7:
    display = (Display *)0xff95;
    break;
  case Numpad8:
    display = (Display *)0xff97;
    break;
  case Numpad9:
    display = (Display *)0xff9a;
    break;
  case F1:
    display = (Display *)0xffbe;
    break;
  case F2:
    display = (Display *)0xffbf;
    break;
  case F3:
    display = (Display *)0xffc0;
    break;
  case F4:
    display = (Display *)0xffc1;
    break;
  case F5:
    display = (Display *)0xffc2;
    break;
  case F6:
    display = (Display *)0xffc3;
    break;
  case F7:
    display = (Display *)0xffc4;
    break;
  case F8:
    display = (Display *)0xffc5;
    break;
  case F9:
    display = (Display *)0xffc6;
    break;
  case F10:
    display = (Display *)0xffc7;
    break;
  case F11:
    display = (Display *)0xffc8;
    break;
  case F12:
    display = (Display *)0xffc9;
    break;
  case F13:
    display = (Display *)0xffca;
    break;
  case F14:
    display = (Display *)0xffcb;
    break;
  case F15:
    display = (Display *)0xffcc;
    break;
  case Pause:
    display = (Display *)0xff13;
    break;
  default:
    display = (Display *)0x0;
  }
  if ((key < A) || (Pause < key)) {
    keysym._7_1_ = false;
  }
  else {
    display_00 = OpenDisplay();
    keys[0x1f] = XKeysymToKeycode(display_00,display);
    if (keys[0x1f] == '\0') {
      CloseDisplay(display_00);
      keysym._7_1_ = false;
    }
    else {
      XQueryKeymap(display_00,local_48);
      CloseDisplay(display_00);
      keysym._7_1_ = ((int)local_48[(int)((byte)keys[0x1f] / 8)] & 1 << (byte)keys[0x1f] % 8) != 0;
    }
  }
  return keysym._7_1_;
}

Assistant:

bool InputImpl::isKeyPressed(Keyboard::Key key)
{
    // Get the corresponding X11 keysym
    KeySym keysym = 0;
    switch (key)
    {
        case Keyboard::LShift:     keysym = XK_Shift_L;      break;
        case Keyboard::RShift:     keysym = XK_Shift_R;      break;
        case Keyboard::LControl:   keysym = XK_Control_L;    break;
        case Keyboard::RControl:   keysym = XK_Control_R;    break;
        case Keyboard::LAlt:       keysym = XK_Alt_L;        break;
        case Keyboard::RAlt:       keysym = XK_Alt_R;        break;
        case Keyboard::LSystem:    keysym = XK_Super_L;      break;
        case Keyboard::RSystem:    keysym = XK_Super_R;      break;
        case Keyboard::Menu:       keysym = XK_Menu;         break;
        case Keyboard::Escape:     keysym = XK_Escape;       break;
        case Keyboard::Semicolon:  keysym = XK_semicolon;    break;
        case Keyboard::Slash:      keysym = XK_slash;        break;
        case Keyboard::Equal:      keysym = XK_equal;        break;
        case Keyboard::Hyphen:     keysym = XK_minus;        break;
        case Keyboard::LBracket:   keysym = XK_bracketleft;  break;
        case Keyboard::RBracket:   keysym = XK_bracketright; break;
        case Keyboard::Comma:      keysym = XK_comma;        break;
        case Keyboard::Period:     keysym = XK_period;       break;
        case Keyboard::Quote:      keysym = XK_apostrophe;   break;
        case Keyboard::Backslash:  keysym = XK_backslash;    break;
        case Keyboard::Tilde:      keysym = XK_grave;        break;
        case Keyboard::Space:      keysym = XK_space;        break;
        case Keyboard::Enter:      keysym = XK_Return;       break;
        case Keyboard::Backspace:  keysym = XK_BackSpace;    break;
        case Keyboard::Tab:        keysym = XK_Tab;          break;
        case Keyboard::PageUp:     keysym = XK_Prior;        break;
        case Keyboard::PageDown:   keysym = XK_Next;         break;
        case Keyboard::End:        keysym = XK_End;          break;
        case Keyboard::Home:       keysym = XK_Home;         break;
        case Keyboard::Insert:     keysym = XK_Insert;       break;
        case Keyboard::Delete:     keysym = XK_Delete;       break;
        case Keyboard::Add:        keysym = XK_KP_Add;       break;
        case Keyboard::Subtract:   keysym = XK_KP_Subtract;  break;
        case Keyboard::Multiply:   keysym = XK_KP_Multiply;  break;
        case Keyboard::Divide:     keysym = XK_KP_Divide;    break;
        case Keyboard::Pause:      keysym = XK_Pause;        break;
        case Keyboard::F1:         keysym = XK_F1;           break;
        case Keyboard::F2:         keysym = XK_F2;           break;
        case Keyboard::F3:         keysym = XK_F3;           break;
        case Keyboard::F4:         keysym = XK_F4;           break;
        case Keyboard::F5:         keysym = XK_F5;           break;
        case Keyboard::F6:         keysym = XK_F6;           break;
        case Keyboard::F7:         keysym = XK_F7;           break;
        case Keyboard::F8:         keysym = XK_F8;           break;
        case Keyboard::F9:         keysym = XK_F9;           break;
        case Keyboard::F10:        keysym = XK_F10;          break;
        case Keyboard::F11:        keysym = XK_F11;          break;
        case Keyboard::F12:        keysym = XK_F12;          break;
        case Keyboard::F13:        keysym = XK_F13;          break;
        case Keyboard::F14:        keysym = XK_F14;          break;
        case Keyboard::F15:        keysym = XK_F15;          break;
        case Keyboard::Left:       keysym = XK_Left;         break;
        case Keyboard::Right:      keysym = XK_Right;        break;
        case Keyboard::Up:         keysym = XK_Up;           break;
        case Keyboard::Down:       keysym = XK_Down;         break;
        case Keyboard::Numpad0:    keysym = XK_KP_Insert;    break;
        case Keyboard::Numpad1:    keysym = XK_KP_End;       break;
        case Keyboard::Numpad2:    keysym = XK_KP_Down;      break;
        case Keyboard::Numpad3:    keysym = XK_KP_Page_Down; break;
        case Keyboard::Numpad4:    keysym = XK_KP_Left;      break;
        case Keyboard::Numpad5:    keysym = XK_KP_Begin;     break;
        case Keyboard::Numpad6:    keysym = XK_KP_Right;     break;
        case Keyboard::Numpad7:    keysym = XK_KP_Home;      break;
        case Keyboard::Numpad8:    keysym = XK_KP_Up;        break;
        case Keyboard::Numpad9:    keysym = XK_KP_Page_Up;   break;
        case Keyboard::A:          keysym = XK_a;            break;
        case Keyboard::B:          keysym = XK_b;            break;
        case Keyboard::C:          keysym = XK_c;            break;
        case Keyboard::D:          keysym = XK_d;            break;
        case Keyboard::E:          keysym = XK_e;            break;
        case Keyboard::F:          keysym = XK_f;            break;
        case Keyboard::G:          keysym = XK_g;            break;
        case Keyboard::H:          keysym = XK_h;            break;
        case Keyboard::I:          keysym = XK_i;            break;
        case Keyboard::J:          keysym = XK_j;            break;
        case Keyboard::K:          keysym = XK_k;            break;
        case Keyboard::L:          keysym = XK_l;            break;
        case Keyboard::M:          keysym = XK_m;            break;
        case Keyboard::N:          keysym = XK_n;            break;
        case Keyboard::O:          keysym = XK_o;            break;
        case Keyboard::P:          keysym = XK_p;            break;
        case Keyboard::Q:          keysym = XK_q;            break;
        case Keyboard::R:          keysym = XK_r;            break;
        case Keyboard::S:          keysym = XK_s;            break;
        case Keyboard::T:          keysym = XK_t;            break;
        case Keyboard::U:          keysym = XK_u;            break;
        case Keyboard::V:          keysym = XK_v;            break;
        case Keyboard::W:          keysym = XK_w;            break;
        case Keyboard::X:          keysym = XK_x;            break;
        case Keyboard::Y:          keysym = XK_y;            break;
        case Keyboard::Z:          keysym = XK_z;            break;
        case Keyboard::Num0:       keysym = XK_0;            break;
        case Keyboard::Num1:       keysym = XK_1;            break;
        case Keyboard::Num2:       keysym = XK_2;            break;
        case Keyboard::Num3:       keysym = XK_3;            break;
        case Keyboard::Num4:       keysym = XK_4;            break;
        case Keyboard::Num5:       keysym = XK_5;            break;
        case Keyboard::Num6:       keysym = XK_6;            break;
        case Keyboard::Num7:       keysym = XK_7;            break;
        case Keyboard::Num8:       keysym = XK_8;            break;
        case Keyboard::Num9:       keysym = XK_9;            break;
        default:                   keysym = 0;               break;
    }

    // Sanity checks
    if (key < 0 || key >= sf::Keyboard::KeyCount)
        return false;

    // Open a connection with the X server
    Display* display = OpenDisplay();

    // Convert to keycode
    KeyCode keycode = XKeysymToKeycode(display, keysym);
    if (keycode != 0)
    {
        // Get the whole keyboard state
        char keys[32];
        XQueryKeymap(display, keys);

        // Close the connection with the X server
        CloseDisplay(display);

        // Check our keycode
        return (keys[keycode / 8] & (1 << (keycode % 8))) != 0;
    }
    else
    {
        // Close the connection with the X server
        CloseDisplay(display);

        return false;
    }
}